

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O2

uint fixup(wb_tree *tree,wb_node *n)

{
  wb_node *pwVar1;
  wb_node *pwVar2;
  wb_node *pwVar3;
  wb_node *pwVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  char *pcVar14;
  
  pwVar1 = n->llink;
  if (pwVar1 == (wb_node *)0x0) {
    uVar5 = 1000;
  }
  else {
    uVar5 = pwVar1->weight * 1000;
  }
  if (uVar5 < n->weight * 0x125) {
    pwVar1 = n->rlink;
    if (pwVar1 == (wb_node *)0x0) {
      pcVar14 = "nr != NULL";
      uVar8 = 0xa5;
      goto LAB_00105d94;
    }
    pwVar2 = pwVar1->llink;
    if (pwVar2 == (wb_node *)0x0) {
      if (pwVar1->weight * 0x24a < 0x3e9) {
        pcVar14 = "nrl != NULL";
        uVar8 = 0xaf;
        goto LAB_00105d94;
      }
    }
    else if (pwVar1->weight * 0x24a <= pwVar2->weight * 1000) {
      pwVar3 = n->parent;
      pwVar2->parent = pwVar3;
      if (pwVar3 != (wb_node *)0x0) {
        tree = (wb_tree *)&pwVar3->rlink;
        if (pwVar3->llink == n) {
          tree = (wb_tree *)&pwVar3->llink;
        }
      }
      tree->root = pwVar2;
      pwVar3 = pwVar2->llink;
      pwVar2->llink = n;
      n->parent = pwVar2;
      n->rlink = pwVar3;
      if (pwVar3 != (wb_node *)0x0) {
        pwVar3->parent = n;
      }
      pwVar4 = pwVar2->rlink;
      pwVar2->rlink = pwVar1;
      pwVar1->parent = pwVar2;
      pwVar1->llink = pwVar4;
      if (pwVar4 != (wb_node *)0x0) {
        pwVar4->parent = pwVar1;
      }
      uVar6 = 1;
      uVar13 = uVar6;
      if (n->llink != (wb_node *)0x0) {
        uVar13 = n->llink->weight;
      }
      uVar12 = uVar6;
      if (pwVar3 != (wb_node *)0x0) {
        uVar12 = pwVar3->weight;
      }
      n->weight = uVar12 + uVar13;
      uVar11 = uVar6;
      if (pwVar4 != (wb_node *)0x0) {
        uVar11 = pwVar4->weight;
      }
      if (pwVar1->rlink != (wb_node *)0x0) {
        uVar6 = pwVar1->rlink->weight;
      }
      pwVar1->weight = uVar6 + uVar11;
      pwVar2->weight = uVar6 + uVar11 + uVar12 + uVar13;
      goto LAB_00105d01;
    }
    tree_node_rot_left(tree,n);
    uVar5 = 1;
    uVar9 = uVar5;
    if (n->llink != (wb_node *)0x0) {
      uVar9 = n->llink->weight;
    }
    uVar7 = uVar5;
    if (n->rlink != (wb_node *)0x0) {
      uVar7 = n->rlink->weight;
    }
    n->weight = uVar7 + uVar9;
    uVar10 = uVar5;
    if (pwVar1->rlink != (wb_node *)0x0) {
      uVar10 = pwVar1->rlink->weight;
    }
    pwVar1->weight = uVar10 + uVar7 + uVar9;
  }
  else {
    if (uVar5 <= n->weight * 0x2c3) {
      return 0;
    }
    if (pwVar1 == (wb_node *)0x0) {
      pcVar14 = "nl != NULL";
      uVar8 = 0xc6;
LAB_00105d94:
      fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,uVar8,"fixup",pcVar14);
      abort();
    }
    if (pwVar1->llink == (wb_node *)0x0) {
      uVar13 = 1;
    }
    else {
      uVar13 = pwVar1->llink->weight;
    }
    if (pwVar1->weight * 0x19e < uVar13 * 1000) {
      tree_node_rot_right(tree,n);
      uVar12 = 1;
      uVar6 = uVar12;
      if (n->llink != (wb_node *)0x0) {
        uVar6 = n->llink->weight;
      }
      if (n->rlink != (wb_node *)0x0) {
        uVar12 = n->rlink->weight;
      }
      n->weight = uVar12 + uVar6;
      pwVar1->weight = uVar12 + uVar6 + uVar13;
      return 1;
    }
    pwVar2 = pwVar1->rlink;
    if (pwVar2 == (wb_node *)0x0) {
      pcVar14 = "nlr != NULL";
      uVar8 = 0xd1;
      goto LAB_00105d94;
    }
    pwVar3 = n->parent;
    pwVar2->parent = pwVar3;
    if (pwVar3 != (wb_node *)0x0) {
      tree = (wb_tree *)&pwVar3->rlink;
      if (pwVar3->llink == n) {
        tree = (wb_tree *)&pwVar3->llink;
      }
    }
    tree->root = pwVar2;
    pwVar3 = pwVar2->llink;
    pwVar2->llink = pwVar1;
    pwVar1->parent = pwVar2;
    pwVar1->rlink = pwVar3;
    if (pwVar3 != (wb_node *)0x0) {
      pwVar3->parent = pwVar1;
    }
    pwVar4 = pwVar2->rlink;
    pwVar2->rlink = n;
    n->parent = pwVar2;
    n->llink = pwVar4;
    uVar6 = 1;
    uVar13 = uVar6;
    if (pwVar4 != (wb_node *)0x0) {
      pwVar4->parent = n;
      uVar13 = pwVar4->weight;
    }
    uVar12 = uVar6;
    if (n->rlink != (wb_node *)0x0) {
      uVar12 = n->rlink->weight;
    }
    n->weight = uVar12 + uVar13;
    uVar11 = uVar6;
    if (pwVar1->llink != (wb_node *)0x0) {
      uVar11 = pwVar1->llink->weight;
    }
    if (pwVar3 != (wb_node *)0x0) {
      uVar6 = pwVar3->weight;
    }
    pwVar1->weight = uVar6 + uVar11;
    pwVar2->weight = uVar6 + uVar11 + uVar12 + uVar13;
LAB_00105d01:
    uVar5 = 2;
  }
  return uVar5;
}

Assistant:

static inline unsigned
fixup(wb_tree* tree, wb_node* n)
{
    unsigned rotations = 0;
    unsigned weight = WEIGHT(n->llink);
    if (weight * 1000U < n->weight * 293U) {
	wb_node* nr = n->rlink;
	ASSERT(nr != NULL);
	wb_node* nrl = nr->llink;
	if (WEIGHT(nrl) * 1000U < nr->weight * 586U) {	/* LL */
	    /* Rotate |n| left. */
	    tree_node_rot_left(tree, n);
	    nr->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink)) +
			 WEIGHT(nr->rlink);
	    rotations += 1;
	} else {					/* RL */
	    /* Rotate |nr| right, then |n| left. */
	    ASSERT(nrl != NULL);
	    wb_node* const p = n->parent;
	    nrl->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nrl;

	    wb_node* const a = nrl->llink;
	    nrl->llink = n;
	    n->parent = nrl;
	    if ((n->rlink = a) != NULL)
		a->parent = n;

	    wb_node* const b = nrl->rlink;
	    nrl->rlink = nr;
	    nr->parent = nrl;
	    if ((nr->llink = b) != NULL)
		b->parent = nr;

	    nrl->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(a)) +
			  (nr->weight = WEIGHT(b) + WEIGHT(nr->rlink));
	    rotations += 2;
	}
    } else if (weight * 1000U > n->weight * 707U) {
	wb_node* nl = n->llink;
	ASSERT(nl != NULL);
	weight = WEIGHT(nl->llink);
	if (weight * 1000U > nl->weight * 414U) {	/* RR */
	    tree_node_rot_right(tree, n);

	    n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink);
	    nl->weight = weight + n->weight;
	    rotations += 1;
	} else {					/* LR */
	    /* Rotate |nl| left, then |n| right. */
	    wb_node* nlr = nl->rlink;
	    ASSERT(nlr != NULL);
	    wb_node* const p = n->parent;
	    nlr->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nlr;

	    wb_node* const a = nlr->llink;
	    nlr->llink = nl;
	    nl->parent = nlr;
	    if ((nl->rlink = a) != NULL)
		a->parent = nl;

	    wb_node* const b = nlr->rlink;
	    nlr->rlink = n;
	    n->parent = nlr;
	    if ((n->llink = b) != NULL)
		b->parent = n;

	    nlr->weight = (n->weight = WEIGHT(b) + WEIGHT(n->rlink)) +
			  (nl->weight = WEIGHT(nl->llink) + WEIGHT(a));
	    rotations += 2;
	}
    }
    return rotations;
}